

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O2

void __thiscall glu::ShaderProgram::~ShaderProgram(ShaderProgram *this)

{
  pointer ppSVar1;
  Shader *this_00;
  int shaderNdx;
  long lVar2;
  int shaderType;
  long lVar3;
  
  for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
    for (lVar2 = 0;
        ppSVar1 = this->m_shaders[lVar3].
                  super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                  super__Vector_impl_data._M_start,
        lVar2 < (int)((ulong)((long)this->m_shaders[lVar3].
                                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1) >> 3
                     ); lVar2 = lVar2 + 1) {
      this_00 = ppSVar1[lVar2];
      if (this_00 != (Shader *)0x0) {
        Shader::~Shader(this_00);
      }
      operator_delete(this_00,0x68);
    }
  }
  Program::~Program(&this->m_program);
  lVar3 = 0x78;
  do {
    std::_Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>::~_Vector_base
              ((_Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_> *)
               ((long)&this->m_shaders[0].
                       super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return;
}

Assistant:

ShaderProgram::~ShaderProgram (void)
{
	for (int shaderType = 0; shaderType < SHADERTYPE_LAST; shaderType++)
		for (int shaderNdx = 0; shaderNdx < (int)m_shaders[shaderType].size(); ++shaderNdx)
			delete m_shaders[shaderType][shaderNdx];
}